

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SpanTest_CtorFromVector_Test::~SpanTest_CtorFromVector_Test
          (SpanTest_CtorFromVector_Test *this)

{
  SpanTest_CtorFromVector_Test *this_local;
  
  ~SpanTest_CtorFromVector_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SpanTest, CtorFromVector) {
  std::vector<int> v = {1, 2};
  // Const ctor is implicit.
  TestConstCtor(v, v.data(), v.size());
  // Mutable is explicit.
  Span<int> s(v);
  TestCtor(s, v.data(), v.size());
}